

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

bool __thiscall QSslConfiguration::isNull(QSslConfiguration *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  QSslConfigurationPrivate *pQVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  QSslDiffieHellmanParameters *in_stack_ffffffffffffffc0;
  bool local_2a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                     ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d2aa);
  bVar2 = false;
  local_2a = false;
  if (pQVar4->protocol == SecureProtocols) {
    pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                       ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d2ce);
    local_2a = false;
    if (pQVar4->peerVerifyMode == AutoVerifyPeer) {
      pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                         ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d2ee);
      local_2a = false;
      if (pQVar4->peerVerifyDepth == 0) {
        pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                           ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d30e);
        local_2a = false;
        if ((pQVar4->allowRootCertOnDemandLoading & 1U) == 1) {
          pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                             ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d332);
          qVar5 = QList<QSslCertificate>::size(&pQVar4->caCertificates);
          local_2a = false;
          if (qVar5 == 0) {
            pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                               ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d35b);
            qVar5 = QList<QSslCipher>::size(&pQVar4->ciphers);
            local_2a = false;
            if (qVar5 == 0) {
              QSharedDataPointer<QSslConfigurationPrivate>::operator->
                        ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d384);
              bVar3 = QList<QSslEllipticCurve>::isEmpty((QList<QSslEllipticCurve> *)0x38d393);
              local_2a = false;
              if (bVar3) {
                QSharedDataPointer<QSslConfigurationPrivate>::operator->
                          ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d3af);
                bVar3 = QSslKey::isNull((QSslKey *)
                                        CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8
                                                ));
                local_2a = false;
                if (bVar3) {
                  pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                     ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d3da);
                  in_stack_ffffffffffffffc0 = &pQVar4->dhParams;
                  QSslDiffieHellmanParameters::defaultParameters();
                  bVar2 = true;
                  bVar3 = ::operator==(in_stack_ffffffffffffffc0,
                                       (QSslDiffieHellmanParameters *)
                                       CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
                                      );
                  local_2a = false;
                  if (bVar3) {
                    QSharedDataPointer<QSslConfigurationPrivate>::operator->
                              ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d41f);
                    bVar3 = QList<QSslCertificate>::isEmpty((QList<QSslCertificate> *)0x38d42b);
                    local_2a = false;
                    if (bVar3) {
                      QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d447);
                      bVar3 = QSslKey::isNull((QSslKey *)
                                              CONCAT17(in_stack_ffffffffffffffbf,
                                                       in_stack_ffffffffffffffb8));
                      local_2a = false;
                      if (bVar3) {
                        QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d46f);
                        bVar3 = QSslCertificate::isNull
                                          ((QSslCertificate *)
                                           CONCAT17(in_stack_ffffffffffffffbf,
                                                    in_stack_ffffffffffffffb8));
                        local_2a = false;
                        if (bVar3) {
                          pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                             ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                              0x38d497);
                          qVar5 = QList<QSslCertificate>::size(&pQVar4->peerCertificateChain);
                          local_2a = false;
                          if (qVar5 == 0) {
                            QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                      ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d4c0);
                            bVar3 = QMap<QByteArray,_QVariant>::isEmpty
                                              ((QMap<QByteArray,_QVariant> *)
                                               in_stack_ffffffffffffffc0);
                            local_2a = false;
                            if (bVar3) {
                              pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                 ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d4eb);
                              bVar3 = ::operator==((QFlags<QSsl::SslOption>)
                                                   (pQVar4->sslOptions).
                                                   super_QFlagsStorageHelper<QSsl::SslOption,_4>.
                                                   super_QFlagsStorage<QSsl::SslOption>.i,
                                                   (QFlags<QSsl::SslOption>)0x55);
                              local_2a = false;
                              if (bVar3) {
                                QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                          ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38d528)
                                ;
                                bVar3 = QByteArray::isNull((QByteArray *)0x38d537);
                                local_2a = false;
                                if (bVar3) {
                                  pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                     ((QSharedDataPointer<QSslConfigurationPrivate>
                                                       *)0x38d553);
                                  local_2a = false;
                                  if (pQVar4->sslSessionTicketLifeTimeHint == -1) {
                                    QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                              ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                               0x38d573);
                                    bVar3 = QByteArray::isNull((QByteArray *)0x38d582);
                                    local_2a = false;
                                    if (bVar3) {
                                      QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                 0x38d59e);
                                      bVar3 = QList<QByteArray>::isEmpty
                                                        ((QList<QByteArray> *)0x38d5ad);
                                      local_2a = false;
                                      if (bVar3) {
                                        QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                   0x38d5c9);
                                        bVar3 = QByteArray::isNull((QByteArray *)0x38d5d8);
                                        local_2a = false;
                                        if (bVar3) {
                                          pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::
                                                   operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d5f1);
                                          local_2a = false;
                                          if (pQVar4->nextProtocolNegotiationStatus ==
                                              NextProtocolNegotiationNone) {
                                            pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>::
                                                     operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d60d);
                                            local_2a = false;
                                            if ((pQVar4->ocspStaplingEnabled & 1U) == 0) {
                                              pQVar4 = QSharedDataPointer<QSslConfigurationPrivate>
                                                       ::operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d62d);
                                              local_2a = false;
                                              if ((pQVar4->reportFromCallback & 1U) == 0) {
                                                pQVar4 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d64d);
                                                local_2a = (pQVar4->missingCertIsFatal & 1U) == 0;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (bVar2) {
    QSslDiffieHellmanParameters::~QSslDiffieHellmanParameters(in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2a;
}

Assistant:

bool QSslConfiguration::isNull() const
{
    return (d->protocol == QSsl::SecureProtocols &&
            d->peerVerifyMode == QSslSocket::AutoVerifyPeer &&
            d->peerVerifyDepth == 0 &&
            d->allowRootCertOnDemandLoading == true &&
            d->caCertificates.size() == 0 &&
            d->ciphers.size() == 0 &&
            d->ellipticCurves.isEmpty() &&
            d->ephemeralServerKey.isNull() &&
            d->dhParams == QSslDiffieHellmanParameters::defaultParameters() &&
            d->localCertificateChain.isEmpty() &&
            d->privateKey.isNull() &&
            d->peerCertificate.isNull() &&
            d->peerCertificateChain.size() == 0 &&
            d->backendConfig.isEmpty() &&
            d->sslOptions == QSslConfigurationPrivate::defaultSslOptions &&
            d->sslSession.isNull() &&
            d->sslSessionTicketLifeTimeHint == -1 &&
            d->preSharedKeyIdentityHint.isNull() &&
            d->nextAllowedProtocols.isEmpty() &&
            d->nextNegotiatedProtocol.isNull() &&
            d->nextProtocolNegotiationStatus == QSslConfiguration::NextProtocolNegotiationNone &&
            d->ocspStaplingEnabled == false &&
            d->reportFromCallback == false &&
            d->missingCertIsFatal == false);
}